

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * Catch::toString(string *value)

{
  uint uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  IConfig *pIVar2;
  ulong uVar3;
  ulong uVar4;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string subs;
  size_t i;
  string s;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  ulong local_50;
  Ptr<const_Catch::IConfig> local_38;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)getCurrentContext();
  (*(*(_func_int ***)__lhs)[6])(&local_38);
  pIVar2 = Ptr<const_Catch::IConfig>::operator->(&local_38);
  uVar1 = (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])();
  Ptr<const_Catch::IConfig>::~Ptr
            ((Ptr<const_Catch::IConfig> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  if ((uVar1 & 1) != 0) {
    for (local_50 = 0; uVar4 = local_50, uVar3 = std::__cxx11::string::size(), uVar4 < uVar3;
        local_50 = local_50 + 1) {
      std::__cxx11::string::string(local_70);
      in_stack_fffffffffffffeb8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::operator[]((ulong)local_30);
      in_stack_fffffffffffffeb4 = (int)(char)*in_stack_fffffffffffffeb8;
      if (in_stack_fffffffffffffeb4 == 9) {
        std::__cxx11::string::operator=(local_70,"\\t");
      }
      else if (in_stack_fffffffffffffeb4 == 10) {
        std::__cxx11::string::operator=(local_70,"\\n");
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::substr((ulong)local_d0,(ulong)local_30);
        std::operator+(in_stack_fffffffffffffeb8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        std::__cxx11::string::substr((ulong)local_f0,(ulong)local_30);
        std::operator+(__lhs,in_RDI);
        std::__cxx11::string::operator=(local_30,local_90);
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
        local_50 = local_50 + 1;
      }
      std::__cxx11::string::~string(local_70);
    }
  }
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+(in_stack_fffffffffffffeb8,
                 (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}